

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldump.c
# Opt level: O3

void dumpFunction(DumpState *D,Proto *f,TString *psource)

{
  TValue *pTVar1;
  int iVar2;
  ulong in_RAX;
  byte bVar3;
  size_t sVar4;
  long lVar5;
  size_t sVar6;
  bool bVar7;
  lu_byte x;
  ulong local_38;
  
  local_38 = in_RAX;
  if ((D->strip == 0) && (f->source != psource)) {
    dumpString(D,f->source);
  }
  else {
    dumpSize(D,0);
  }
  dumpSize(D,(long)f->linedefined);
  dumpSize(D,(long)f->lastlinedefined);
  local_38 = CONCAT71(local_38._1_7_,f->numparams);
  if (D->status == 0) {
    iVar2 = (*D->writer)(D->L,&local_38,1,D->data);
    D->status = iVar2;
    local_38 = CONCAT71(local_38._1_7_,f->is_vararg);
    if (iVar2 == 0) {
      iVar2 = (*D->writer)(D->L,&local_38,1,D->data);
      D->status = iVar2;
      local_38 = CONCAT71(local_38._1_7_,f->maxstacksize);
      if (iVar2 == 0) {
        iVar2 = (*D->writer)(D->L,&local_38,1,D->data);
        D->status = iVar2;
      }
    }
  }
  dumpSize(D,(long)f->sizecode);
  if (((long)f->sizecode != 0) && (D->status == 0)) {
    iVar2 = (*D->writer)(D->L,f->code,(long)f->sizecode << 2,D->data);
    D->status = iVar2;
  }
  sVar6 = (size_t)f->sizek;
  dumpSize(D,sVar6);
  if (0 < (long)sVar6) {
    lVar5 = 0;
    do {
      pTVar1 = f->k;
      bVar3 = (&pTVar1->tt_)[lVar5] & 0x3f;
      local_38 = CONCAT71(local_38._1_7_,(&pTVar1->tt_)[lVar5]) & 0xffffffffffffff3f;
      if (D->status == 0) {
        iVar2 = (*D->writer)(D->L,&local_38,1,D->data);
        D->status = iVar2;
        bVar7 = iVar2 == 0;
      }
      else {
        bVar7 = false;
      }
      if (bVar3 < 0x13) {
        if (bVar3 == 3) {
          local_38 = *(ulong *)((long)&pTVar1->value_ + lVar5);
LAB_0014235c:
          if (bVar7) {
            iVar2 = (*D->writer)(D->L,&local_38,8,D->data);
            D->status = iVar2;
          }
        }
        else if (bVar3 == 4) goto LAB_00142344;
      }
      else {
        if (bVar3 != 0x14) {
          if (bVar3 != 0x13) goto LAB_00142375;
          local_38 = *(ulong *)((long)&pTVar1->value_ + lVar5);
          goto LAB_0014235c;
        }
LAB_00142344:
        dumpString(D,*(TString **)((long)&pTVar1->value_ + lVar5));
      }
LAB_00142375:
      lVar5 = lVar5 + 0x10;
    } while (sVar6 * 0x10 != lVar5);
  }
  sVar6 = (size_t)f->sizeupvalues;
  dumpSize(D,sVar6);
  if (0 < (long)sVar6) {
    iVar2 = D->status;
    lVar5 = 0;
    do {
      local_38 = CONCAT71(local_38._1_7_,(&f->upvalues->instack)[lVar5]);
      if (iVar2 == 0) {
        iVar2 = (*D->writer)(D->L,&local_38,1,D->data);
        D->status = iVar2;
        local_38 = CONCAT71(local_38._1_7_,(&f->upvalues->idx)[lVar5]);
        if (iVar2 == 0) {
          iVar2 = (*D->writer)(D->L,&local_38,1,D->data);
          D->status = iVar2;
          local_38 = CONCAT71(local_38._1_7_,(&f->upvalues->kind)[lVar5]);
          if (iVar2 == 0) {
            iVar2 = (*D->writer)(D->L,&local_38,1,D->data);
            D->status = iVar2;
          }
        }
      }
      lVar5 = lVar5 + 0x10;
    } while (sVar6 * 0x10 != lVar5);
  }
  sVar6 = (size_t)f->sizep;
  dumpSize(D,sVar6);
  if (0 < (long)sVar6) {
    sVar4 = 0;
    do {
      dumpFunction(D,f->p[sVar4],f->source);
      sVar4 = sVar4 + 1;
    } while (sVar6 != sVar4);
  }
  if (D->strip == 0) {
    sVar6 = (size_t)f->sizelineinfo;
  }
  else {
    sVar6 = 0;
  }
  dumpSize(D,sVar6);
  if ((sVar6 != 0) && (D->status == 0)) {
    iVar2 = (*D->writer)(D->L,f->lineinfo,sVar6,D->data);
    D->status = iVar2;
  }
  if (D->strip == 0) {
    sVar6 = (size_t)f->sizeabslineinfo;
    dumpSize(D,sVar6);
    if (0 < (long)sVar6) {
      sVar4 = 0;
      do {
        dumpSize(D,(long)f->abslineinfo[sVar4].pc);
        dumpSize(D,(long)f->abslineinfo[sVar4].line);
        sVar4 = sVar4 + 1;
      } while (sVar6 != sVar4);
    }
  }
  else {
    dumpSize(D,0);
  }
  if (D->strip == 0) {
    sVar6 = (size_t)f->sizelocvars;
    dumpSize(D,sVar6);
    if (0 < (long)sVar6) {
      lVar5 = 0;
      do {
        dumpString(D,*(TString **)((long)&f->locvars->varname + lVar5));
        dumpSize(D,(long)*(int *)((long)&f->locvars->startpc + lVar5));
        dumpSize(D,(long)*(int *)((long)&f->locvars->endpc + lVar5));
        lVar5 = lVar5 + 0x10;
      } while (sVar6 * 0x10 != lVar5);
    }
  }
  else {
    dumpSize(D,0);
  }
  if (D->strip == 0) {
    sVar6 = (size_t)f->sizeupvalues;
    dumpSize(D,sVar6);
    if (0 < (long)sVar6) {
      lVar5 = 0;
      do {
        dumpString(D,*(TString **)((long)&f->upvalues->name + lVar5));
        lVar5 = lVar5 + 0x10;
      } while (sVar6 * 0x10 != lVar5);
    }
  }
  else {
    dumpSize(D,0);
  }
  return;
}

Assistant:

static void dumpFunction (DumpState *D, const Proto *f, TString *psource) {
  if (D->strip || f->source == psource)
    dumpString(D, NULL);  /* no debug info or same source as its parent */
  else
    dumpString(D, f->source);
  dumpInt(D, f->linedefined);
  dumpInt(D, f->lastlinedefined);
  dumpByte(D, f->numparams);
  dumpByte(D, f->is_vararg);
  dumpByte(D, f->maxstacksize);
  dumpCode(D, f);
  dumpConstants(D, f);
  dumpUpvalues(D, f);
  dumpProtos(D, f);
  dumpDebug(D, f);
}